

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.cc
# Opt level: O1

void __thiscall iqxmlrpc::http::Header::Header(Header *this,Verification_level lev)

{
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  string local_c8;
  string local_a8;
  undefined1 local_88 [32];
  undefined1 local_68 [32];
  undefined1 local_48 [32];
  
  this->_vptr_Header = (_func_int **)&PTR__Header_00189c30;
  (this->head_line_)._M_dataplus._M_p = (pointer)&(this->head_line_).field_2;
  (this->head_line_)._M_string_length = 0;
  (this->head_line_).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->options_)._M_t._M_impl.super__Rb_tree_header;
  (this->options_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->options_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->options_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->options_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->options_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->validators_)._M_t._M_impl.super__Rb_tree_header;
  (this->validators_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->validators_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->validators_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->validators_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->validators_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->ver_level_ = lev;
  paVar2 = &local_c8.field_2;
  local_c8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"connection","");
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"close","");
  set_option_default(this,&local_c8,&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  local_c8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"content-length","");
  local_48._8_8_ = validator::unsigned_number;
  local_48._0_8_ =
       boost::function1<void,std::__cxx11::string_const&>::
       assign_to<void(*)(std::__cxx11::string_const&)>(void(*)(std::__cxx11::string_const&))::
       stored_vtable_abi_cxx11_ + 1;
  register_validator(this,&local_c8,(Option_validator_fn *)local_48,HTTP_CHECK_WEAK);
  boost::
  function1<void,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~function1((function1<void,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  local_c8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"expect","");
  local_68._8_8_ = validator::expect_continue;
  local_68._0_8_ =
       boost::function1<void,std::__cxx11::string_const&>::
       assign_to<void(*)(std::__cxx11::string_const&)>(void(*)(std::__cxx11::string_const&))::
       stored_vtable_abi_cxx11_ + 1;
  register_validator(this,&local_c8,(Option_validator_fn *)local_68,HTTP_CHECK_WEAK);
  boost::
  function1<void,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~function1((function1<void,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  local_c8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"content-type","");
  local_88._8_8_ = validator::content_type;
  local_88._0_8_ =
       boost::function1<void,std::__cxx11::string_const&>::
       assign_to<void(*)(std::__cxx11::string_const&)>(void(*)(std::__cxx11::string_const&))::
       stored_vtable_abi_cxx11_ + 1;
  register_validator(this,&local_c8,(Option_validator_fn *)local_88,HTTP_CHECK_STRICT);
  boost::
  function1<void,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~function1((function1<void,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

Header::Header(Verification_level lev):
  ver_level_(lev)
{
  set_option_default(names::connection, "close");
  register_validator(names::content_length, validator::unsigned_number, HTTP_CHECK_WEAK);
  register_validator(names::expect_continue, validator::expect_continue, HTTP_CHECK_WEAK);
  register_validator(names::content_type, validator::content_type, HTTP_CHECK_STRICT);
}